

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_icdf<trng::uniform01_dist<double>>(uniform01_dist<double> *d)

{
  result_type_conflict2 x;
  pointer pdVar1;
  int i;
  int iVar2;
  pointer pdVar3;
  double dVar4;
  result_type_conflict2 rVar5;
  result_type_conflict2 rVar6;
  vector<double,_std::allocator<double>_> p_values;
  double local_d8;
  SourceLineInfo local_d0;
  double eps;
  StringRef local_b8;
  AssertionHandler catchAssertionHandler;
  BinaryExpr<const_double_&,_const_double_&> local_60;
  
  eps = 5.6843418860808015e-14;
  p_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  p_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x3fe0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_values,(double *)&catchAssertionHandler);
  for (iVar2 = 2; iVar2 != 0x35; iVar2 = iVar2 + 1) {
    dVar4 = pow(*p_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,(double)iVar2);
    catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)(dVar4 + 0.0);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&p_values,(double *)&catchAssertionHandler);
    dVar4 = pow(*p_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,(double)iVar2);
    catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)(1.0 - dVar4);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&p_values,(double *)&catchAssertionHandler);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (p_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             p_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pdVar1 = p_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = p_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    x = *pdVar3;
    rVar5 = trng::uniform01_dist<double>::icdf(d,x);
    rVar6 = 1.0;
    if (rVar5 <= 1.0) {
      rVar6 = rVar5;
    }
    dVar4 = ABS((double)(~-(ulong)(rVar5 < 0.0) & (ulong)rVar6) - x);
    if (5.6843418860808015e-14 <= dVar4) {
      local_60.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x2602f7;
      local_60.super_ITransientExpression.m_isBinaryExpression = true;
      local_60.super_ITransientExpression.m_result = false;
      local_60.super_ITransientExpression._10_6_ = 0;
      local_d0.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_d0.line = 0xa8;
      Catch::StringRef::StringRef(&local_b8,"std::abs(y - p) < eps");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_60,&local_d0,local_b8,Normal);
      local_d0.file = (char *)&local_d8;
      local_d8 = dVar4;
      Catch::ExprLhs<double_const&>::operator<(&local_60,(ExprLhs<double_const&> *)&local_d0,&eps);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_60.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_60.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&p_values.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}